

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_terminal_attr<std::array<float,3ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedTerminalAttribute<std::array<float,_3UL>_> *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  indent_00 = (uint32_t)name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this[0x208] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)name & 0xffffffff),n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT17(local_1f8.field_2._M_local_buf[7],
                               CONCAT16(local_1f8.field_2._M_local_buf[6],
                                        CONCAT24(local_1f8.field_2._M_allocated_capacity._4_2_,
                                                 local_1f8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (*(long *)(this + 0x218) == 0) {
      paVar1 = &local_1f8.field_2;
      local_1f8.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
      local_1f8.field_2._M_allocated_capacity._4_2_ = 0x3374;
      local_1f8._M_string_length = 6;
      local_1f8.field_2._M_local_buf[6] = '\0';
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        CONCAT17(local_1f8.field_2._M_local_buf[7],
                                 CONCAT16(local_1f8.field_2._M_local_buf[6],
                                          CONCAT24(local_1f8.field_2._M_allocated_capacity._4_2_,
                                                   local_1f8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    else {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,*(char **)(this + 0x210),*(long *)(this + 0x218));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    }
    bVar2 = AttrMetas::authored((AttrMetas *)this);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_(&local_1f8,this,(AttrMeta *)(ulong)((uint32_t)name + 1),indent_00)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        CONCAT17(local_1f8.field_2._M_local_buf[7],
                                 CONCAT16(local_1f8.field_2._M_local_buf[6],
                                          CONCAT24(local_1f8.field_2._M_allocated_capacity._4_2_,
                                                   local_1f8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_terminal_attr(const TypedTerminalAttribute<T> &attr,
                                      const std::string &name,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {
    ss << pprint::Indent(indent);

    if (attr.has_actual_type()) {
      ss << attr.get_actual_type_name() << " " << name;
    } else {
      ss << value::TypeTraits<T>::type_name() << " " << name;
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";
  }

  return ss.str();
}